

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void boxsum(int32_t *src,int width,int height,int src_stride,int r,int sqr,int32_t *dst,
           int dst_stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int32_t *piVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int32_t *piVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int *local_80;
  int *local_78;
  int *local_68;
  
  if (r == 2) {
    if (sqr == 0) {
      if (0 < width) {
        lVar6 = (long)dst_stride;
        lVar14 = (long)src_stride;
        local_80 = src + lVar14 * 5;
        local_68 = dst + lVar6 * 2;
        uVar17 = 0;
        do {
          piVar4 = src + uVar17;
          iVar13 = *piVar4;
          iVar15 = piVar4[lVar14];
          iVar12 = piVar4[src_stride * 2];
          iVar19 = piVar4[src_stride * 3];
          iVar21 = iVar15 + iVar13 + iVar12;
          iVar16 = piVar4[src_stride << 2];
          piVar4 = dst + uVar17;
          *piVar4 = iVar21;
          piVar4[lVar6] = iVar21 + iVar19;
          uVar11 = 2;
          if (5 < height) {
            uVar11 = 2;
            piVar8 = local_68;
            piVar7 = local_80;
            iVar21 = iVar13;
            iVar1 = iVar15;
            iVar2 = iVar12;
            iVar3 = iVar19;
            do {
              iVar19 = iVar16;
              iVar12 = iVar3;
              iVar15 = iVar2;
              iVar13 = iVar1;
              *piVar8 = iVar15 + iVar13 + iVar12 + iVar19 + iVar21;
              iVar16 = *piVar7;
              uVar11 = uVar11 + 1;
              piVar7 = piVar7 + lVar14;
              piVar8 = piVar8 + lVar6;
              iVar21 = iVar13;
              iVar1 = iVar15;
              iVar2 = iVar12;
              iVar3 = iVar19;
            } while (height - 3 != uVar11);
          }
          iVar16 = iVar12 + iVar19 + iVar16;
          iVar15 = iVar15 + iVar16;
          iVar12 = (int)uVar11;
          piVar4[iVar12 * dst_stride] = iVar13 + iVar15;
          piVar4[(iVar12 + 1) * dst_stride] = iVar15;
          piVar4[(iVar12 + 2) * dst_stride] = iVar16;
          uVar17 = uVar17 + 1;
          local_80 = local_80 + 1;
          local_68 = local_68 + 1;
        } while (uVar17 != (uint)width);
      }
    }
    else if (0 < width) {
      lVar14 = (long)dst_stride;
      lVar6 = (long)src_stride;
      local_78 = src + lVar6 * 5;
      local_80 = dst + lVar14 * 2;
      uVar17 = 0;
      do {
        piVar4 = src + uVar17;
        iVar15 = *piVar4 * *piVar4;
        iVar16 = piVar4[lVar6] * piVar4[lVar6];
        iVar21 = piVar4[src_stride * 2] * piVar4[src_stride * 2];
        iVar19 = piVar4[src_stride * 3] * piVar4[src_stride * 3];
        iVar13 = piVar4[src_stride << 2] * piVar4[src_stride << 2];
        iVar12 = iVar16 + iVar15 + iVar21;
        piVar4 = dst + uVar17;
        *piVar4 = iVar12;
        piVar4[lVar14] = iVar12 + iVar19;
        uVar11 = 2;
        if (5 < height) {
          uVar11 = 2;
          piVar8 = local_80;
          piVar7 = local_78;
          iVar12 = iVar15;
          iVar1 = iVar16;
          iVar2 = iVar21;
          iVar3 = iVar19;
          do {
            iVar19 = iVar13;
            iVar21 = iVar3;
            iVar16 = iVar2;
            iVar15 = iVar1;
            *piVar8 = iVar16 + iVar15 + iVar21 + iVar19 + iVar12;
            iVar13 = *piVar7 * *piVar7;
            uVar11 = uVar11 + 1;
            piVar7 = piVar7 + lVar6;
            piVar8 = piVar8 + lVar14;
            iVar12 = iVar15;
            iVar1 = iVar16;
            iVar2 = iVar21;
            iVar3 = iVar19;
          } while (height - 3 != uVar11);
        }
        iVar13 = iVar21 + iVar19 + iVar13;
        iVar16 = iVar16 + iVar13;
        iVar12 = (int)uVar11;
        piVar4[iVar12 * dst_stride] = iVar15 + iVar16;
        piVar4[(iVar12 + 1) * dst_stride] = iVar16;
        piVar4[(iVar12 + 2) * dst_stride] = iVar13;
        uVar17 = uVar17 + 1;
        local_78 = local_78 + 1;
        local_80 = local_80 + 1;
      } while (uVar17 != (uint)width);
    }
    if (0 < height) {
      lVar14 = (long)dst_stride;
      lVar6 = 0x500000000;
      uVar17 = 0;
      piVar5 = dst;
      do {
        lVar20 = uVar17 * lVar14;
        iVar13 = dst[lVar20];
        iVar15 = dst[lVar20 + 1];
        iVar12 = dst[lVar20 + 2];
        iVar19 = dst[lVar20 + 3];
        iVar21 = iVar15 + iVar13 + iVar12;
        iVar16 = dst[lVar20 + 4];
        dst[lVar20] = iVar21;
        dst[lVar20 + 1] = iVar21 + iVar19;
        uVar11 = 2;
        if (5 < width) {
          uVar11 = 2;
          lVar18 = lVar6;
          iVar21 = iVar13;
          iVar1 = iVar15;
          iVar2 = iVar12;
          iVar3 = iVar19;
          do {
            iVar19 = iVar16;
            iVar12 = iVar3;
            iVar15 = iVar2;
            iVar13 = iVar1;
            piVar5[uVar11] = iVar15 + iVar13 + iVar12 + iVar19 + iVar21;
            iVar16 = *(int *)((long)dst + (lVar18 >> 0x1e));
            uVar11 = uVar11 + 1;
            lVar18 = lVar18 + 0x100000000;
            iVar21 = iVar13;
            iVar1 = iVar15;
            iVar2 = iVar12;
            iVar3 = iVar19;
          } while (width - 3 != uVar11);
        }
        iVar16 = iVar12 + iVar19 + iVar16;
        iVar15 = iVar15 + iVar16;
        iVar12 = (int)uVar11;
        dst[lVar20 + iVar12] = iVar13 + iVar15;
        dst[iVar12 + (int)lVar20 + 1] = iVar15;
        dst[iVar12 + 2 + (int)lVar20] = iVar16;
        uVar17 = uVar17 + 1;
        piVar5 = piVar5 + lVar14;
        lVar6 = lVar6 + (lVar14 << 0x20);
      } while (uVar17 != (uint)height);
    }
  }
  else if (r == 1) {
    lVar6 = (long)dst_stride;
    if (sqr == 0) {
      if (0 < width) {
        lVar14 = (long)src_stride;
        piVar5 = src + lVar14 * 3;
        piVar4 = dst + lVar6;
        uVar17 = 0;
        do {
          piVar8 = src + uVar17;
          iVar13 = *piVar8;
          iVar15 = piVar8[lVar14];
          iVar12 = piVar8[src_stride * 2];
          dst[uVar17] = iVar15 + iVar13;
          uVar11 = 1;
          if (3 < height) {
            uVar11 = 1;
            piVar8 = piVar4;
            piVar10 = piVar5;
            iVar19 = iVar13;
            iVar16 = iVar15;
            do {
              iVar15 = iVar12;
              iVar13 = iVar16;
              *piVar8 = iVar19 + iVar13 + iVar15;
              iVar12 = *piVar10;
              uVar11 = uVar11 + 1;
              piVar10 = piVar10 + lVar14;
              piVar8 = piVar8 + lVar6;
              iVar19 = iVar13;
              iVar16 = iVar15;
            } while (height - 2 != uVar11);
          }
          dst[uVar17 + (long)((int)uVar11 * dst_stride)] = iVar13 + iVar15 + iVar12;
          dst[uVar17 + (long)(((int)uVar11 + 1) * dst_stride)] = iVar15 + iVar12;
          uVar17 = uVar17 + 1;
          piVar5 = piVar5 + 1;
          piVar4 = piVar4 + 1;
        } while (uVar17 != (uint)width);
      }
    }
    else if (0 < width) {
      lVar14 = (long)src_stride;
      piVar4 = src + lVar14 * 3;
      piVar8 = dst + lVar6;
      uVar17 = 0;
      do {
        piVar7 = src + uVar17;
        iVar15 = *piVar7 * *piVar7;
        iVar12 = piVar7[lVar14] * piVar7[lVar14];
        iVar13 = piVar7[src_stride * 2] * piVar7[src_stride * 2];
        dst[uVar17] = iVar12 + iVar15;
        uVar11 = 1;
        if (3 < height) {
          uVar11 = 1;
          piVar7 = piVar8;
          piVar9 = piVar4;
          iVar19 = iVar15;
          iVar16 = iVar12;
          do {
            iVar12 = iVar13;
            iVar15 = iVar16;
            *piVar7 = iVar19 + iVar15 + iVar12;
            iVar13 = *piVar9 * *piVar9;
            uVar11 = uVar11 + 1;
            piVar9 = piVar9 + lVar14;
            piVar7 = piVar7 + lVar6;
            iVar19 = iVar15;
            iVar16 = iVar12;
          } while (height - 2 != uVar11);
        }
        dst[uVar17 + (long)((int)uVar11 * dst_stride)] = iVar15 + iVar12 + iVar13;
        dst[uVar17 + (long)(((int)uVar11 + 1) * dst_stride)] = iVar12 + iVar13;
        uVar17 = uVar17 + 1;
        piVar4 = piVar4 + 1;
        piVar8 = piVar8 + 1;
      } while (uVar17 != (uint)width);
    }
    if (0 < height) {
      lVar14 = 0x300000000;
      uVar17 = 0;
      piVar5 = dst;
      do {
        lVar20 = uVar17 * lVar6;
        iVar13 = dst[lVar20];
        iVar15 = dst[lVar20 + 1];
        iVar12 = dst[lVar20 + 2];
        dst[lVar20] = iVar15 + iVar13;
        uVar11 = 1;
        if (3 < width) {
          uVar11 = 1;
          lVar18 = lVar14;
          iVar19 = iVar13;
          iVar16 = iVar15;
          do {
            iVar15 = iVar12;
            iVar13 = iVar16;
            piVar5[uVar11] = iVar19 + iVar13 + iVar15;
            iVar12 = *(int *)((long)dst + (lVar18 >> 0x1e));
            uVar11 = uVar11 + 1;
            lVar18 = lVar18 + 0x100000000;
            iVar19 = iVar13;
            iVar16 = iVar15;
          } while (width - 2 != uVar11);
        }
        dst[lVar20 + (int)uVar11] = iVar13 + iVar15 + iVar12;
        dst[(int)lVar20 + (int)uVar11 + 1] = iVar15 + iVar12;
        uVar17 = uVar17 + 1;
        piVar5 = piVar5 + lVar6;
        lVar14 = lVar14 + (lVar6 << 0x20);
      } while (uVar17 != (uint)height);
    }
  }
  return;
}

Assistant:

static void boxsum(int32_t *src, int width, int height, int src_stride, int r,
                   int sqr, int32_t *dst, int dst_stride) {
  if (r == 1)
    boxsum1(src, width, height, src_stride, sqr, dst, dst_stride);
  else if (r == 2)
    boxsum2(src, width, height, src_stride, sqr, dst, dst_stride);
  else
    assert(0 && "Invalid value of r in self-guided filter");
}